

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int read_header(archive_read *a,archive_entry *entry)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  mtree *mtree;
  __mode_t p;
  uint uVar4;
  int iVar5;
  mode_t mVar6;
  char *pcVar7;
  int *piVar8;
  archive_entry_linkresolver *res;
  void *__s;
  void *pvVar9;
  archive_string *paVar10;
  ulong uVar11;
  size_t sVar12;
  size_t len;
  la_int64_t lVar13;
  size_t sVar14;
  long lVar15;
  mtree_entry *pmVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  mtree_option **global_00;
  mtree_entry *pmVar20;
  byte *pbVar21;
  long lVar22;
  long lVar23;
  undefined1 *puVar24;
  mtree_entry *pmVar25;
  mtree_option *global;
  archive_entry *sparse_entry;
  stat st_storage;
  archive_entry *local_108;
  uint local_fc;
  mtree_entry *local_f8;
  archive_string *local_f0;
  mtree_entry *local_e8;
  int local_dc;
  archive_entry *local_d8;
  archive_entry *local_d0;
  mtree_entry *local_c8;
  stat local_c0;
  
  mtree = (mtree *)a->format->data;
  if (-1 < mtree->fd) {
    close(mtree->fd);
    mtree->fd = -1;
  }
  if (mtree->entries == (mtree_entry *)0x0) {
    res = archive_entry_linkresolver_new();
    mtree->resolver = res;
    if (res == (archive_entry_linkresolver *)0x0) {
      pcVar18 = (char *)0xffffffe2;
      goto LAB_004649cf;
    }
    local_d8 = entry;
    archive_entry_linkresolver_set_strategy(res,0x80000);
    mtree->archive_format = 0x80000;
    mtree->archive_format_name = "mtree";
    local_108 = (archive_entry *)0x0;
    detect_form(a,(int *)&local_d0);
    local_f0 = (archive_string *)0x1;
    __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
    if (__s != (void *)0x0) {
      local_c8 = (mtree_entry *)&mtree->entries;
      local_e8 = (mtree_entry *)0x0;
LAB_004641de:
      pcVar7 = (char *)0x0;
      lVar22 = 0;
      do {
        pmVar25 = (mtree_entry *)local_c0.st_dev;
        if ((long)local_c0.st_dev < 0) goto LAB_00464994;
        pvVar9 = memchr(__s,10,local_c0.st_dev);
        if (pvVar9 != (void *)0x0) {
          pmVar25 = (mtree_entry *)((long)pvVar9 + (1 - (long)__s));
          local_c0.st_dev = (__dev_t)pmVar25;
        }
        if (0xffff < (long)(pcVar7 + (long)&pmVar25->next)) {
          pcVar18 = "Line too long";
          iVar5 = 0x54;
          goto LAB_0046498d;
        }
        paVar10 = archive_string_ensure
                            ((archive_string *)mtree,(size_t)(pcVar7 + (long)&pmVar25->next + 1));
        if (paVar10 == (archive_string *)0x0) {
          pcVar18 = "Can\'t allocate working buffer";
          iVar5 = 0xc;
          goto LAB_0046498d;
        }
        memcpy((mtree->line).s + (long)pcVar7,__s,local_c0.st_dev);
        __archive_read_consume(a,local_c0.st_dev);
        pcVar18 = pcVar7 + (long)(mtree_entry **)local_c0.st_dev;
        (mtree->line).s[(long)pcVar18] = '\0';
        pcVar19 = (mtree->line).s;
        pbVar21 = (byte *)(pcVar19 + lVar22);
LAB_00464279:
        bVar2 = *pbVar21;
        if (bVar2 < 0x5c) {
          if (bVar2 == 0x23) {
            if (pvVar9 == (void *)0x0) goto LAB_004642c1;
          }
          else {
            if (bVar2 == 0) goto LAB_004642c1;
            if (bVar2 == 10) {
              if (pcVar18 == (char *)0x0) break;
              if (-1 < (long)pcVar18) {
                lVar23 = -(long)pcVar7;
                pcVar18 = pcVar7 + 1;
                lVar22 = 0;
                goto LAB_00464308;
              }
              free_options((mtree_option *)local_108);
              entry = local_d8;
              if ((int)pcVar18 != 0) goto LAB_004649cf;
              goto LAB_00463dad;
            }
          }
LAB_004642af:
          pbVar21 = pbVar21 + 1;
          goto LAB_00464279;
        }
        if ((bVar2 != 0x5c) || (pbVar21[1] == 0)) goto LAB_004642af;
        if (pbVar21[1] != 10) {
          pbVar21 = pbVar21 + 1;
          goto LAB_004642af;
        }
        (pcVar19 + -2)[(long)pcVar18] = '\0';
        pcVar19 = (mtree->line).s;
        pcVar18 = pcVar18 + -2;
LAB_004642c1:
        pcVar7 = pcVar18;
        lVar22 = (long)pbVar21 - (long)pcVar19;
        __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
      } while (__s != (void *)0x0);
    }
LAB_004647d8:
    mtree->this_entry = mtree->entries;
    free_options((mtree_option *)local_108);
    entry = local_d8;
  }
LAB_00463dad:
  (a->archive).archive_format = mtree->archive_format;
  (a->archive).archive_format_name = mtree->archive_format_name;
  pmVar25 = mtree->this_entry;
  if (pmVar25 != (mtree_entry *)0x0) {
    paVar10 = &mtree->current_dir;
    local_f0 = paVar10;
    do {
      pcVar18 = pmVar25->name;
      if (((*pcVar18 == '.') && (pcVar18[1] == '.')) && (pcVar18[2] == '\0')) {
        pmVar25->used = '\x01';
        sVar14 = (mtree->current_dir).length;
        if (sVar14 != 0) {
          pcVar18 = paVar10->s;
          pcVar7 = pcVar18 + sVar14;
          do {
            pcVar19 = pcVar7;
            pcVar7 = pcVar19 + -1;
            if (pcVar7 < pcVar18) break;
          } while (*pcVar7 != '/');
          pcVar19 = pcVar19 + -2;
          if (pcVar7 < pcVar18) {
            pcVar19 = pcVar7;
          }
          (mtree->current_dir).length = (size_t)(pcVar19 + (1 - (long)pcVar18));
        }
      }
      else if (pmVar25->used == '\0') {
        pmVar25->used = '\x01';
        local_108 = entry;
        archive_entry_set_filetype(entry,0x8000);
        archive_entry_set_size(entry,0);
        (mtree->contents_name).length = 0;
        local_fc = 0;
        uVar4 = parse_line(a,entry,mtree,pmVar25,(int *)&local_fc);
        pcVar18 = (char *)(ulong)uVar4;
        if (pmVar25->full == '\0') {
          sVar14 = (mtree->current_dir).length;
          if (sVar14 != 0) {
            archive_strcat(paVar10,"/");
          }
          archive_strcat(paVar10,pmVar25->name);
          archive_entry_copy_pathname(entry,paVar10->s);
          mVar6 = archive_entry_filetype(entry);
          if (mVar6 != 0x4000) {
            (mtree->current_dir).length = sVar14;
          }
        }
        else {
          archive_entry_copy_pathname(entry,pmVar25->name);
          for (pmVar20 = pmVar25->next; pmVar20 != (mtree_entry *)0x0; pmVar20 = pmVar20->next) {
            if (((pmVar20->full != '\0') && (pmVar20->used == '\0')) &&
               (iVar5 = strcmp(pmVar25->name,pmVar20->name), iVar5 == 0)) {
              pmVar20->used = '\x01';
              uVar4 = parse_line(a,entry,mtree,pmVar20,(int *)&local_fc);
              if ((int)uVar4 < (int)pcVar18) {
                pcVar18 = (char *)(ulong)uVar4;
              }
            }
          }
        }
        if (mtree->checkfs != '\0') {
          mtree->fd = -1;
          if ((mtree->contents_name).length == 0) {
            pcVar7 = archive_entry_pathname(entry);
          }
          else {
            pcVar7 = (mtree->contents_name).s;
          }
          mVar6 = archive_entry_filetype(entry);
          paVar10 = local_f0;
          if ((mVar6 == 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 == 0x4000)) {
            iVar5 = open(pcVar7,0x80000);
            mtree->fd = iVar5;
            __archive_ensure_cloexec_flag(iVar5);
            iVar5 = mtree->fd;
            if (iVar5 == -1) {
              piVar8 = __errno_location();
              if ((*piVar8 != 2) || ((mtree->contents_name).length != 0)) {
                archive_set_error(&a->archive,*piVar8,"Can\'t open %s",pcVar7);
                pcVar18 = (char *)0xffffffec;
              }
              goto LAB_00463f8a;
            }
          }
          else {
LAB_00463f8a:
            iVar5 = mtree->fd;
          }
          if (iVar5 < 0) {
            iVar5 = lstat(pcVar7,&local_c0);
            if (iVar5 != -1) goto LAB_00463fe4;
LAB_00464019:
            if ((local_fc & 0x800) == 0) goto LAB_0046491f;
LAB_00464135:
            pmVar25 = mtree->this_entry;
            goto LAB_00464139;
          }
          iVar5 = fstat(iVar5,&local_c0);
          if (iVar5 == -1) {
            piVar8 = __errno_location();
            archive_set_error(&a->archive,*piVar8,"Could not fstat %s",pcVar7);
            close(mtree->fd);
            mtree->fd = -1;
            pcVar18 = (char *)0xffffffec;
            goto LAB_00464019;
          }
LAB_00463fe4:
          p = local_c0.st_mode;
          uVar4 = local_c0.st_mode & 0xf000;
          if (uVar4 == 0xa000) {
            mVar6 = archive_entry_filetype(entry);
            if (mVar6 != 0xa000) goto LAB_00464083;
          }
          else if ((uVar4 != 0x8000) || (mVar6 = archive_entry_filetype(entry), mVar6 != 0x8000)) {
LAB_00464083:
            if (((~p & 0xc000) != 0) || (mVar6 = archive_entry_filetype(entry), mVar6 != 0xc000)) {
              switch(uVar4 - 0x1000 >> 0xc) {
              case 0:
                mVar6 = archive_entry_filetype(entry);
                if (mVar6 == 0x1000) goto LAB_004647f9;
                break;
              case 1:
                mVar6 = archive_entry_filetype(entry);
                if (mVar6 == 0x2000) goto LAB_004647f9;
                break;
              case 3:
                mVar6 = archive_entry_filetype(entry);
                if (mVar6 == 0x4000) goto LAB_004647f9;
                break;
              case 5:
                mVar6 = archive_entry_filetype(entry);
                if (mVar6 == 0x6000) goto LAB_004647f9;
              }
              if (-1 < mtree->fd) {
                close(mtree->fd);
              }
              mtree->fd = -1;
              if ((local_fc & 0x800) != 0) goto LAB_00464135;
              if ((int)pcVar18 == 0) {
                pcVar18 = archive_entry_pathname(entry);
                archive_set_error(&a->archive,-1,"mtree specification has different type for %s",
                                  pcVar18);
                pcVar18 = (char *)0xffffffec;
              }
              goto LAB_004649cf;
            }
          }
LAB_004647f9:
          uVar4 = local_fc;
          if (((local_fc & 0x1001) != 1) &&
             ((mVar6 = archive_entry_filetype(entry), mVar6 == 0x2000 ||
              (mVar6 = archive_entry_filetype(entry), mVar6 == 0x6000)))) {
            archive_entry_set_rdev(entry,local_c0.st_rdev);
          }
          if ((uVar4 & 0xc) == 0 || (uVar4 >> 0xc & 1) != 0) {
            archive_entry_set_gid(entry,(ulong)local_c0.st_gid);
          }
          if ((uVar4 & 0x600) == 0 || (uVar4 >> 0xc & 1) != 0) {
            archive_entry_set_uid(entry,(ulong)local_c0.st_uid);
          }
          if ((uVar4 & 0x1010) != 0x10) {
            archive_entry_set_mtime(entry,local_c0.st_mtim.tv_sec,local_c0.st_mtim.tv_nsec);
          }
          if ((uVar4 & 0x1020) != 0x20) {
            archive_entry_set_nlink(entry,(uint)local_c0.st_nlink);
          }
          if ((uVar4 & 0x1040) != 0x40) {
            archive_entry_set_perm(entry,p);
          }
          if ((uVar4 & 0x1080) != 0x80) {
            archive_entry_set_size(entry,local_c0.st_size);
          }
          archive_entry_set_ino(entry,local_c0.st_ino);
          archive_entry_set_dev(entry,local_c0.st_dev);
          archive_entry_linkify(mtree->resolver,&local_108,&local_d0);
          entry = local_108;
        }
LAB_0046491f:
        lVar13 = archive_entry_size(entry);
        mtree->cur_size = lVar13;
        mtree->offset = 0;
        goto LAB_004649cf;
      }
LAB_00464139:
      pmVar25 = pmVar25->next;
      mtree->this_entry = pmVar25;
    } while (pmVar25 != (mtree_entry *)0x0);
  }
  pcVar18 = (char *)0x1;
LAB_004649cf:
  return (int)pcVar18;
LAB_00464308:
  uVar11 = (ulong)(byte)pcVar19[lVar22];
  if (0x2f < uVar11) goto LAB_004644af;
  if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
    paVar10 = local_f0;
    if ((0x800002401U >> (uVar11 & 0x3f) & 1) != 0) goto LAB_0046434d;
    if (uVar11 == 0x2f) {
      iVar5 = strncmp(pcVar19 + lVar22,"/set",4);
      if (iVar5 == 0) {
        if ((pcVar19[lVar22 + 4] == ' ') || (pcVar19[lVar22 + 4] == '\t')) {
          pcVar19 = pcVar19 + lVar22 + 4;
          goto LAB_004645a2;
        }
      }
      else {
        iVar5 = strncmp(pcVar19 + lVar22,"/unset",6);
        if ((iVar5 == 0) && ((pcVar19[lVar22 + 6] == ' ' || (pcVar19[lVar22 + 6] == '\t')))) {
          pcVar18 = strchr(pcVar19 + lVar22 + 6,0x3d);
          if (pcVar18 != (char *)0x0) {
            pcVar18 = "/unset shall not contain `=\'";
            iVar5 = -1;
            goto LAB_0046498d;
          }
          sVar12 = strspn(pcVar19 + lVar22 + 6," \t\r\n");
          paVar10 = local_f0;
          cVar3 = pcVar19[lVar22 + 6 + sVar12];
          if (cVar3 == '\0') goto LAB_0046434d;
          pcVar19 = pcVar19 + lVar22 + sVar12 + 6;
          goto LAB_0046442b;
        }
      }
      archive_set_error(&a->archive,0x54,"Can\'t parse line %ju",local_f0);
      goto LAB_00464994;
    }
    goto LAB_004644af;
  }
  lVar22 = lVar22 + 1;
  lVar23 = lVar23 + 1;
  pcVar18 = pcVar18 + -1;
  goto LAB_00464308;
LAB_004645a2:
  sVar12 = strspn(pcVar19," \t\r\n");
  paVar10 = local_f0;
  if (pcVar19[sVar12] == '\0') goto LAB_0046434d;
  pcVar7 = pcVar19 + sVar12;
  sVar12 = strcspn(pcVar7," \t\r\n");
  pcVar19 = pcVar7 + sVar12;
  pcVar18 = strchr(pcVar7,0x3d);
  sVar14 = (long)pcVar18 - (long)pcVar7;
  if (pcVar19 < pcVar18) {
    sVar14 = sVar12;
  }
  remove_option((mtree_option **)&local_108,pcVar7,sVar14);
  uVar4 = add_option(a,(mtree_option **)&local_108,pcVar7,sVar12);
  if (uVar4 != 0) {
    pcVar18 = (char *)(ulong)uVar4;
    goto LAB_004649c5;
  }
  goto LAB_004645a2;
LAB_0046442b:
  do {
    sVar12 = strcspn(pcVar19," \t\r\n");
    sVar14 = sVar12;
    if (sVar12 == 3) {
      if (((cVar3 != 'a') || (pcVar19[1] != 'l')) || (pcVar19[2] != 'l')) {
        sVar14 = 3;
        goto LAB_00464481;
      }
      free_options((mtree_option *)local_108);
      local_108 = (archive_entry *)0x0;
    }
    else {
LAB_00464481:
      remove_option((mtree_option **)&local_108,pcVar19,sVar14);
    }
    pcVar19 = pcVar19 + sVar12;
    sVar12 = strspn(pcVar19," \t\r\n");
    cVar3 = pcVar19[sVar12];
    pcVar19 = pcVar19 + sVar12;
  } while (cVar3 != '\0');
LAB_0046434d:
  local_f0 = (archive_string *)((long)paVar10 + 1);
  __s = __archive_read_ahead(a,1,(ssize_t *)&local_c0);
  if (__s == (void *)0x0) goto LAB_004647d8;
  goto LAB_004641de;
LAB_004644af:
  local_f8 = (mtree_entry *)local_c0.st_dev;
  local_dc = (int)local_d0;
  pmVar25 = (mtree_entry *)malloc(0x20);
  if (pmVar25 != (mtree_entry *)0x0) {
    pmVar20 = (mtree_entry *)(pcVar19 + lVar22);
    pcVar17 = pcVar7 + (long)&local_f8->next;
    lVar15 = (long)pcVar17 - lVar22;
    *(undefined8 *)((long)&pmVar25->options + 2) = 0;
    *(undefined8 *)((long)&pmVar25->name + 2) = 0;
    pmVar25->next = (mtree_entry *)0x0;
    pmVar25->options = (mtree_option *)0x0;
    pmVar16 = local_e8;
    if (local_e8 == (mtree_entry *)0x0) {
      pmVar16 = local_c8;
    }
    pmVar16->next = pmVar25;
    if (local_dc == 0) {
      local_f8 = pmVar20;
      sVar12 = strcspn((char *)pmVar20," \t\r\n");
      pmVar20 = (mtree_entry *)(pcVar19 + lVar22 + sVar12);
      local_e8 = (mtree_entry *)(lVar15 + (long)pmVar20);
    }
    else {
      if (lVar15 < 1) {
        pcVar1 = (char *)((long)pmVar20 + lVar15);
      }
      else {
        pmVar16 = (mtree_entry *)(lVar15 + (long)pmVar20);
        pcVar1 = pcVar19 + lVar22;
        pcVar7 = pcVar7 + (long)(pcVar19 + -1);
        do {
          uVar11 = (ulong)*(byte *)((long)&local_f8->next + (long)pcVar7);
          if ((0x20 < uVar11) || ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0)) {
            local_e8 = (mtree_entry *)(pcVar7 + (lVar22 - (long)pcVar17) + (long)&local_f8->next);
            sVar12 = (long)local_f8 - lVar23;
            lVar23 = lVar23 - (long)local_f8;
            lVar22 = 1;
            goto LAB_0046477b;
          }
          pcVar7 = pcVar7 + -1;
          lVar23 = lVar23 + 1;
          pcVar17 = pcVar17 + -1;
          pcVar19 = pcVar18 + -1;
          pcVar18 = pcVar18 + -1;
          pmVar16 = (mtree_entry *)&pmVar16[-1].field_0x1f;
        } while (1 < (long)(pcVar19 + (long)&local_f8->next));
      }
      local_e8 = (mtree_entry *)(pcVar1 + -1);
      sVar12 = 0;
      local_f8 = local_e8;
    }
LAB_00464659:
    pcVar18 = (char *)malloc(sVar12 + 1);
    pmVar25->name = pcVar18;
    if (pcVar18 != (char *)0x0) {
      global_00 = &pmVar25->options;
      memcpy(pcVar18,local_f8,sVar12);
      pcVar18[sVar12] = '\0';
      local_f8 = pmVar25;
      parse_escapes(pcVar18,pmVar25);
      puVar24 = (undefined1 *)&local_108;
      while (puVar24 = *(undefined1 **)puVar24, puVar24 != (undefined1 *)0x0) {
        pcVar18 = *(char **)((long)puVar24 + 8);
        sVar12 = strlen(pcVar18);
        uVar4 = add_option(a,global_00,pcVar18,sVar12);
        if (uVar4 != 0) goto LAB_0046499c;
      }
      while ((sVar12 = strspn((char *)pmVar20," \t\r\n"),
             *(char *)((long)&pmVar20->next + sVar12) != '\0' &&
             (pmVar25 = (mtree_entry *)((long)&pmVar20->next + sVar12), pmVar25 < local_e8))) {
        len = strcspn((char *)pmVar25," \t\r\n");
        pmVar20 = (mtree_entry *)((long)&pmVar25->next + len);
        pmVar16 = (mtree_entry *)strchr((char *)pmVar25,0x3d);
        sVar12 = (long)pmVar16 - (long)pmVar25;
        if (pmVar20 < pmVar16) {
          sVar12 = len;
        }
        if (pmVar16 == (mtree_entry *)0x0) {
          sVar12 = len;
        }
        remove_option(global_00,(char *)pmVar25,sVar12);
        uVar4 = add_option(a,global_00,(char *)pmVar25,len);
        if (uVar4 != 0) goto LAB_0046499c;
      }
      local_e8 = local_f8;
      paVar10 = local_f0;
      goto LAB_0046434d;
    }
  }
  piVar8 = __errno_location();
  iVar5 = *piVar8;
  pcVar18 = "Can\'t allocate memory";
LAB_0046498d:
  archive_set_error(&a->archive,iVar5,pcVar18);
LAB_00464994:
  pcVar18 = (char *)0xffffffe2;
  goto LAB_004649c5;
LAB_0046477b:
  if (((byte)uVar11 < 0x21) && ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0)) {
    sVar12 = lVar22 - 1;
    local_f8 = pmVar16;
    local_e8 = pmVar16;
    goto LAB_00464659;
  }
  local_f8 = local_e8;
  if (lVar23 + lVar22 == 0) goto LAB_00464659;
  uVar11 = (ulong)(byte)pmVar16[-1].field_0x1e;
  lVar22 = lVar22 + 1;
  pmVar16 = (mtree_entry *)&pmVar16[-1].field_0x1f;
  goto LAB_0046477b;
LAB_0046499c:
  pcVar18 = (char *)(ulong)uVar4;
LAB_004649c5:
  free_options((mtree_option *)local_108);
  goto LAB_004649cf;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct mtree *mtree;
	char *p;
	int r, use_next;

	mtree = (struct mtree *)(a->format->data);

	if (mtree->fd >= 0) {
		close(mtree->fd);
		mtree->fd = -1;
	}

	if (mtree->entries == NULL) {
		mtree->resolver = archive_entry_linkresolver_new();
		if (mtree->resolver == NULL)
			return ARCHIVE_FATAL;
		archive_entry_linkresolver_set_strategy(mtree->resolver,
		    ARCHIVE_FORMAT_MTREE);
		r = read_mtree(a, mtree);
		if (r != ARCHIVE_OK)
			return (r);
	}

	a->archive.archive_format = mtree->archive_format;
	a->archive.archive_format_name = mtree->archive_format_name;

	for (;;) {
		if (mtree->this_entry == NULL)
			return (ARCHIVE_EOF);
		if (strcmp(mtree->this_entry->name, "..") == 0) {
			mtree->this_entry->used = 1;
			if (archive_strlen(&mtree->current_dir) > 0) {
				/* Roll back current path. */
				p = mtree->current_dir.s
				    + mtree->current_dir.length - 1;
				while (p >= mtree->current_dir.s && *p != '/')
					--p;
				if (p >= mtree->current_dir.s)
					--p;
				mtree->current_dir.length
				    = p - mtree->current_dir.s + 1;
			}
		}
		if (!mtree->this_entry->used) {
			use_next = 0;
			r = parse_file(a, entry, mtree, mtree->this_entry,
				&use_next);
			if (use_next == 0)
				return (r);
		}
		mtree->this_entry = mtree->this_entry->next;
	}
}